

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

char * dmrC_show_instruction(dmr_C *C,instruction *insn)

{
  byte bVar1;
  uint uVar2;
  linearizer_state_t *plVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  symbol *psVar7;
  char *pcVar8;
  basic_block_list *pbVar9;
  pseudo_t ppVar10;
  basic_block *pbVar11;
  long *plVar12;
  void *pvVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  allocator *ident;
  char *pcVar18;
  undefined1 local_48 [8];
  ptr_list_iter argiter__;
  
  bVar1 = *(byte *)insn;
  plVar3 = C->L;
  pcVar18 = plVar3->buffer;
  if (insn->bb == (basic_block *)0x0) {
    plVar3->buffer[2] = '\0';
    pcVar18[0] = '#';
    pcVar18[1] = ' ';
    pcVar18 = plVar3->buffer + 2;
  }
  if (bVar1 < 0x41) {
    pcVar6 = stpcpy(pcVar18,opcodes_rel + *(int *)(opcodes_rel + (ulong)bVar1 * 4));
    pcVar18 = pcVar18 + ((int)pcVar6 - (int)pcVar18);
    psVar7 = insn->type;
    if (psVar7 == (symbol *)0x0) {
LAB_0012e4d5:
      uVar15 = *(uint *)insn;
      if (0xff < uVar15) {
        pcVar6 = ".%d";
        goto LAB_0012e4f3;
      }
    }
    else {
      if (*(char *)psVar7 == '\x03') {
        psVar7 = (psVar7->field_14).field_2.ctype.base_type;
      }
      if ((psVar7->field_14).field_2.ctype.base_type != &C->S->fp_type) goto LAB_0012e4d5;
      uVar15 = *(uint *)insn;
      pcVar6 = ".f%d";
LAB_0012e4f3:
      iVar5 = sprintf(pcVar18,pcVar6,(ulong)(uVar15 >> 8));
      pcVar18 = pcVar18 + iVar5;
    }
    psVar7 = insn->type;
    if (psVar7 != (symbol *)0x0) {
      if (*(byte *)psVar7 == 3) {
        psVar7 = *(symbol **)((long)&psVar7->field_14 + 0x38);
      }
      if (((*(byte *)psVar7 | 2) == 6) || (*(byte *)psVar7 == 5)) {
        pcVar18[0] = '*';
        pcVar18[1] = '\0';
        pcVar18 = pcVar18 + 1;
      }
    }
    builtin_strncpy(pcVar18,"                    ",0x14);
    pcVar18 = pcVar18 + 1;
  }
  plVar3 = C->L;
  if (pcVar18 < plVar3->buffer + 0xc) {
    pcVar18 = plVar3->buffer + 0xc;
  }
  iVar5 = (int)pcVar18;
  pcVar6 = pcVar18;
  switch(bVar1) {
  case 2:
    ppVar10 = (insn->field_6).field_4.phi_src;
    if (ppVar10 == &plVar3->void_pseudo || ppVar10 == (pseudo_t)0x0) goto switchD_0012e579_caseD_6;
    goto LAB_0012eae3;
  case 3:
    pbVar11 = (insn->field_6).field_1.bb_true;
    goto LAB_0012e9fc;
  case 4:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar5 = sprintf(pcVar18,"%s, .L%u, .L%u",pcVar6,(ulong)((insn->field_6).field_1.bb_true)->nr,
                    (ulong)((insn->field_6).field_1.bb_false)->nr);
    break;
  case 5:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar6 = stpcpy(pcVar18,pcVar6);
    pcVar6 = pcVar18 + ((int)pcVar6 - iVar5);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    plVar12 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (plVar12 != (long *)0x0) {
      do {
        lVar4 = plVar12[1];
        if (lVar4 == plVar12[2]) {
          iVar5 = sprintf(pcVar6,", %lld -> .L%u",lVar4,(ulong)*(uint *)(*plVar12 + 0x48));
        }
        else if (lVar4 < plVar12[2]) {
          iVar5 = sprintf(pcVar6,", %lld ... %lld -> .L%u");
        }
        else {
          iVar5 = sprintf(pcVar6,", default -> .L%u",(ulong)*(uint *)(*plVar12 + 0x48));
        }
        pcVar6 = pcVar6 + iVar5;
        plVar12 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (plVar12 != (long *)0x0);
    }
  default:
    goto switchD_0012e579_caseD_6;
  case 7:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar6 = stpcpy(pcVar18,pcVar6);
    pcVar6 = pcVar18 + ((int)pcVar6 - iVar5);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    plVar12 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (plVar12 != (long *)0x0) {
      do {
        iVar5 = sprintf(pcVar6,", .L%u",(ulong)*(uint *)(*plVar12 + 0x48));
        pcVar6 = pcVar6 + iVar5;
        plVar12 = (long *)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (plVar12 != (long *)0x0);
    }
    goto switchD_0012e579_caseD_6;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar14 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar6 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar17 = "%s <- %s, %s";
    goto LAB_0012e5ac;
  case 0x23:
  case 0x24:
  case 0x3b:
  case 0x40:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar5 = sprintf(pcVar18,"%s <- %s",pcVar6,pcVar8);
    break;
  case 0x25:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar14 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar17 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    iVar5 = sprintf(pcVar18,"%s <- %s, %s, %s",pcVar6,pcVar8,pcVar14,pcVar17);
    break;
  case 0x29:
  case 0x3a:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar15 = (insn->field_6).field_5.offset;
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar14 = "%s <- %d[%s]";
    goto LAB_0012e6c2;
  case 0x2a:
  case 0x39:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    uVar15 = (insn->field_6).field_5.offset;
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar14 = "%s -> %d[%s]";
LAB_0012e6c2:
    iVar5 = sprintf(pcVar18,pcVar14,pcVar6,(ulong)uVar15,pcVar8);
    pcVar6 = pcVar18 + iVar5;
    pbVar9 = (basic_block_list *)(insn->field_6).field_1.bb_false;
    if (pbVar9 == (basic_block_list *)0x0) goto switchD_0012e579_caseD_6;
    if (pbVar9->allocator_ == (allocator *)0x0) {
      pcVar18 = "; <anon symbol:%p>";
    }
    else {
      pbVar9 = (basic_block_list *)dmrC_show_ident(C,(ident *)pbVar9->allocator_);
      pcVar18 = "; %s";
    }
LAB_0012ecdc:
    iVar5 = sprintf(pcVar6,pcVar18,pbVar9);
    pcVar18 = pcVar6;
    break;
  case 0x2b:
    pbVar11 = (insn->field_6).field_1.bb_false;
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar5 = sprintf(pcVar18,"%s <- ",pcVar6);
    pcVar6 = pcVar18 + iVar5;
    if (pbVar11 == (basic_block *)0x0) {
      builtin_strncpy(pcVar18 + iVar5,"<none>",7);
      pcVar6 = pcVar6 + 6;
      goto switchD_0012e579_caseD_6;
    }
    bVar1 = *(byte *)&pbVar11->pos;
    uVar16 = (ulong)bVar1;
    if (bVar1 < 3) {
      if (bVar1 == 1) {
        pbVar9 = pbVar11->parents;
        pcVar18 = "%lld";
        goto LAB_0012ecdc;
      }
      if (bVar1 == 2) {
        pbVar9 = (basic_block_list *)dmrC_show_string(C,(string *)pbVar11->children);
        pcVar18 = "%.40s";
        goto LAB_0012ecdc;
      }
LAB_0012ed60:
      pcVar8 = "SETVAL EXPR TYPE %d";
      goto LAB_0012ea06;
    }
    if (bVar1 != 3) {
      pcVar18 = pcVar6;
      if (bVar1 == 0x17) {
        pbVar11 = pbVar11->parents->list_[0x16];
        if (pbVar11 == (basic_block *)0x0) goto switchD_0012e579_caseD_6;
        goto LAB_0012e9fc;
      }
      if (bVar1 != 0x1c) goto LAB_0012ed60;
      iVar5 = sprintf(pcVar6,"%Lf");
      break;
    }
    ident = pbVar11->parents->allocator_;
LAB_0012ed2a:
    pcVar18 = dmrC_show_ident(C,(ident *)ident);
    goto LAB_0012eaeb;
  case 0x2c:
    pbVar9 = ((insn->field_6).field_1.bb_true)->parents;
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    iVar5 = sprintf(pcVar18,"%s <- ",pcVar6);
    pcVar6 = pcVar18 + iVar5;
    if (insn->bb == (basic_block *)0x0 && pbVar9 == (basic_block_list *)0x0)
    goto switchD_0012e579_caseD_6;
    pbVar11 = pbVar9->list_[0x16];
    pcVar18 = pcVar6;
    if (pbVar11 == (basic_block *)0x0) {
      ident = pbVar9->allocator_;
      if (ident != (allocator *)0x0) goto LAB_0012ed2a;
      pcVar18 = "<anon symbol:%p>";
      goto LAB_0012ecdc;
    }
LAB_0012e9fc:
    uVar16 = (ulong)pbVar11->nr;
    pcVar8 = ".L%u";
    pcVar6 = pcVar18;
LAB_0012ea06:
    iVar5 = sprintf(pcVar6,pcVar8,uVar16);
    pcVar18 = pcVar6;
    break;
  case 0x2e:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar6 = stpcpy(pcVar18,pcVar6);
    pcVar6 = pcVar18 + ((int)pcVar6 - iVar5);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_true);
    ppVar10 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (ppVar10 != (pseudo_t)0x0) {
      pcVar18 = " <-";
      do {
        pcVar8 = dmrC_show_pseudo(C,ppVar10);
        iVar5 = sprintf(pcVar6,"%s %s",pcVar18,pcVar8);
        pcVar6 = pcVar6 + iVar5;
        ppVar10 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
        pcVar18 = ",";
      } while (ppVar10 != (pseudo_t)0x0);
    }
    goto switchD_0012e579_caseD_6;
  case 0x2f:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar5 = sprintf(pcVar18,"%s <- %s    ",pcVar6,pcVar8);
    pcVar6 = pcVar18 + iVar5;
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    pvVar13 = ptrlist_iter_next((ptr_list_iter *)local_48);
    if (pvVar13 != (void *)0x0) {
      do {
        pcVar18 = dmrC_show_pseudo(C,*(pseudo_t *)((long)pvVar13 + 0x20));
        iVar5 = sprintf(pcVar6," (%s)",pcVar18);
        pcVar6 = pcVar6 + iVar5;
        pvVar13 = ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (pvVar13 != (void *)0x0);
    }
    goto switchD_0012e579_caseD_6;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pbVar11 = (insn->field_6).field_1.bb_false;
    if (pbVar11 == (basic_block *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar2 = *(uint *)&pbVar11->priv;
      uVar15 = 0;
      if (0 < (int)uVar2) {
        uVar15 = uVar2;
      }
    }
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar5 = sprintf(pcVar18,"%s <- (%d) %s",pcVar6,(ulong)uVar15,pcVar8);
    break;
  case 0x34:
  case 0x35:
    ppVar10 = (insn->field_5).target;
    if (ppVar10 != &plVar3->void_pseudo && ppVar10 != (pseudo_t)0x0) {
      pcVar6 = dmrC_show_pseudo(C,ppVar10);
      iVar5 = sprintf(pcVar18,"%s <- ",pcVar6);
      pcVar18 = pcVar18 + iVar5;
    }
    pcVar6 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar6 = stpcpy(pcVar18,pcVar6);
    pcVar6 = pcVar18 + ((int)pcVar6 - (int)pcVar18);
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)(insn->field_6).field_1.bb_false)
    ;
    ppVar10 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
    if (ppVar10 != (pseudo_t)0x0) {
      do {
        pcVar18 = dmrC_show_pseudo(C,ppVar10);
        iVar5 = sprintf(pcVar6,", %s",pcVar18);
        pcVar6 = pcVar6 + iVar5;
        ppVar10 = (pseudo_t)ptrlist_iter_next((ptr_list_iter *)local_48);
      } while (ppVar10 != (pseudo_t)0x0);
    }
    goto switchD_0012e579_caseD_6;
  case 0x38:
    pcVar6 = dmrC_show_pseudo(C,(insn->field_5).target);
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    iVar5 = sprintf(pcVar18,"%s <- %s, %d, %d",pcVar6,pcVar8,(ulong)(insn->field_6).field_7.from,
                    (ulong)(insn->field_6).field_7.len);
    break;
  case 0x3c:
    ppVar10 = (insn->field_5).target;
LAB_0012eae3:
    pcVar18 = dmrC_show_pseudo(C,ppVar10);
LAB_0012eaeb:
    pcVar18 = stpcpy(pcVar6,pcVar18);
    iVar5 = (int)pcVar18 - (int)pcVar6;
    pcVar18 = pcVar6;
    break;
  case 0x3d:
    pcVar6 = show_asm(C,pcVar18,insn);
    goto switchD_0012e579_caseD_6;
  case 0x3e:
    pcVar6 = "check: ";
    if ((insn->field_6).field_10.check == 0) {
      pcVar6 = "";
    }
    iVar5 = sprintf(pcVar18,"%s%d",pcVar6,(ulong)(uint)(insn->field_6).field_10.increment);
    break;
  case 0x3f:
    pcVar8 = dmrC_show_pseudo(C,(insn->field_6).field_4.phi_src);
    pcVar14 = dmrC_show_pseudo(C,(insn->field_6).field_6.src2);
    pcVar6 = dmrC_show_pseudo(C,(insn->field_6).field_6.src3);
    pcVar17 = "%s between %s..%s";
LAB_0012e5ac:
    iVar5 = sprintf(pcVar18,pcVar17,pcVar8,pcVar14,pcVar6);
  }
  pcVar6 = pcVar18 + iVar5;
switchD_0012e579_caseD_6:
  if (pcVar6 < &C->L->n) {
    pcVar6 = pcVar6 + 1;
    do {
      pcVar18 = pcVar6 + -2;
      pcVar6 = pcVar6 + -1;
    } while (*pcVar18 == ' ');
    *pcVar6 = '\0';
    return C->L->buffer;
  }
  dmrC_die(C,"instruction buffer overflowed %td\n",pcVar6 + (-0x470 - (long)C->L));
}

Assistant:

const char *dmrC_show_instruction(struct dmr_C *C, struct instruction *insn)
{
	int opcode = insn->opcode;
	char *buf;

	buf = C->L->buffer;
	if (!insn->bb)
		buf += sprintf(buf, "# ");

	if (opcode < (int)ARRAY_SIZE(opcodes)) {
		const char *op = opcodes[opcode];
		if (!op)
			buf += sprintf(buf, "opcode:%d", opcode);
		else
			buf += sprintf(buf, "%s", op);
		if (insn->type && dmrC_is_float_type(C->S, insn->type))
			buf += sprintf(buf, ".f%d", insn->size);
		else if (insn->size)
			buf += sprintf(buf, ".%d", insn->size);
		if (insn->type) {
			if (dmrC_is_ptr_type(insn->type))
				buf += sprintf(buf, "*");
		}

		memset(buf, ' ', 20);
		buf++;
	}

	if (buf < C->L->buffer + 12)
		buf = C->L->buffer + 12;
	switch (opcode) {
	case OP_RET:
		if (insn->src && insn->src != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->src));
		break;
	case OP_CBR:
		buf += sprintf(buf, "%s, .L%u, .L%u", dmrC_show_pseudo(C, insn->cond), insn->bb_true->nr, insn->bb_false->nr);
		break;

	case OP_BR:
		buf += sprintf(buf, ".L%u", insn->bb_true->nr);
		break;

	case OP_SYMADDR: {
		struct symbol *sym = insn->symbol->sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!insn->bb && !sym)
			break;
		if (sym->bb_target) {
			buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		}
		if (sym->ident) {
			buf += sprintf(buf, "%s", dmrC_show_ident(C, sym->ident));
			break;
		}
		buf += sprintf(buf, "<anon symbol:%p>", sym);
		break;
	}
		
	case OP_SETVAL: {
		struct expression *expr = insn->val;
		struct symbol *sym;
		buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));

		if (!expr) {
			buf += sprintf(buf, "%s", "<none>");
			break;
		}
			
		switch (expr->type) {
		case EXPR_VALUE:
			buf += sprintf(buf, "%lld", expr->value);
			break;
		case EXPR_FVALUE:
			buf += sprintf(buf, "%Lf", expr->fvalue);
			break;
		case EXPR_STRING:
			buf += sprintf(buf, "%.40s", dmrC_show_string(C, expr->string));
			break;
		case EXPR_SYMBOL:
			buf += sprintf(buf, "%s", dmrC_show_ident(C, expr->symbol->ident));
			break;
		case EXPR_LABEL:
			sym = expr->symbol;
			if (sym->bb_target)
				buf += sprintf(buf, ".L%u", sym->bb_target->nr);
			break;
		default:
			buf += sprintf(buf, "SETVAL EXPR TYPE %d", expr->type);
		}
		break;
	}
	case OP_SWITCH: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->cond));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			if (jmp->begin == jmp->end)
				buf += sprintf(buf, ", %lld -> .L%u", jmp->begin, jmp->target->nr);
			else if (jmp->begin < jmp->end)
				buf += sprintf(buf, ", %lld ... %lld -> .L%u", jmp->begin, jmp->end, jmp->target->nr);
			else
				buf += sprintf(buf, ", default -> .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}
	case OP_COMPUTEDGOTO: {
		struct multijmp *jmp;
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->multijmp_list, jmp) {
			buf += sprintf(buf, ", .L%u", jmp->target->nr);
		} END_FOR_EACH_PTR(jmp);
		break;
	}

	case OP_PHISOURCE: {
		struct instruction *phi;
		buf += sprintf(buf, "%s <- %s    ", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->phi_src));
		FOR_EACH_PTR(insn->phi_users, phi) {
			buf += sprintf(buf, " (%s)", dmrC_show_pseudo(C, phi->target));
		} END_FOR_EACH_PTR(phi);
		break;
	}

	case OP_PHI: {
		pseudo_t phi;
		const char *s = " <-";
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		FOR_EACH_PTR(insn->phi_list, phi) {
			buf += sprintf(buf, "%s %s", s, dmrC_show_pseudo(C, phi));
			s = ",";
		} END_FOR_EACH_PTR(phi);
		break;
	}	
	case OP_LOAD: case OP_LNOP:
		buf += sprintf(buf, "%s <- %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_STORE: case OP_SNOP:
		buf += sprintf(buf, "%s -> %d[%s]", dmrC_show_pseudo(C, insn->target), insn->offset, dmrC_show_pseudo(C, insn->src));
		if (insn->orig_type) {
			struct symbol *sym = insn->orig_type;
			if (sym->ident) {
				buf += sprintf(buf, "; %s", dmrC_show_ident(C, sym->ident));
			}
			else {
				buf += sprintf(buf, "; <anon symbol:%p>", sym);
			}
		}
		break;
	case OP_INLINED_CALL:
	case OP_CALL: {
		if (insn->target && insn->target != VOID_PSEUDO(C))
			buf += sprintf(buf, "%s <- ", dmrC_show_pseudo(C, insn->target));
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->func));
		{
			struct pseudo *arg;
			FOR_EACH_PTR(insn->arguments, arg) {
				buf += sprintf(buf, ", %s", dmrC_show_pseudo(C, arg));
			} END_FOR_EACH_PTR(arg);
		}
		break;
	}
	case OP_CAST:
	case OP_SCAST:
	case OP_FPCAST:
	case OP_PTRCAST:
		buf += sprintf(buf, "%s <- (%d) %s",
			dmrC_show_pseudo(C, insn->target),
			type_size(insn->orig_type),
			dmrC_show_pseudo(C, insn->src));
		break;
	case OP_ADD:
	case OP_SUB:
	case OP_MULU:
	case OP_MULS:
	case OP_DIVU:
	case OP_DIVS:
	case OP_MODU: 
	case OP_MODS:
	case OP_SHL:
	case OP_LSR: 
	case OP_ASR:
	case OP_AND:
	case OP_OR:      
	case OP_XOR:
	case OP_AND_BOOL:
	case OP_OR_BOOL:
	case OP_SET_EQ:
	case OP_SET_NE:
	case OP_SET_LE:
	case OP_SET_GE:
	case OP_SET_LT:
	case OP_SET_GT:
	case OP_SET_B:
	case OP_SET_A:
	case OP_SET_BE:
	case OP_SET_AE:

		buf += sprintf(buf, "%s <- %s, %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2));
		break;

	case OP_SEL:
		buf += sprintf(buf, "%s <- %s, %s, %s", dmrC_show_pseudo(C, insn->target),
			dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;

	case OP_SLICE:
		buf += sprintf(buf, "%s <- %s, %d, %d", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->base), insn->from, insn->len);
		break;

	case OP_NOT: case OP_NEG:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;

	case OP_CONTEXT:
		buf += sprintf(buf, "%s%d", insn->check ? "check: " : "", insn->increment);
		break;
	case OP_RANGE:
		buf += sprintf(buf, "%s between %s..%s", dmrC_show_pseudo(C, insn->src1), dmrC_show_pseudo(C, insn->src2), dmrC_show_pseudo(C, insn->src3));
		break;
	case OP_NOP:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src1));
		break;
	case OP_DEATHNOTE:
		buf += sprintf(buf, "%s", dmrC_show_pseudo(C, insn->target));
		break;
	case OP_ASM:
		buf = show_asm(C, buf, insn);
		break;
	case OP_COPY:
		buf += sprintf(buf, "%s <- %s", dmrC_show_pseudo(C, insn->target), dmrC_show_pseudo(C, insn->src));
		break;
	default:
		break;
	}

	if (buf >= C->L->buffer + sizeof(C->L->buffer))
		dmrC_die(C, "instruction buffer overflowed %td\n", buf - C->L->buffer);
	do { --buf; } while (*buf == ' ');
	*++buf = 0;
	return C->L->buffer;
}